

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufWriteQuotedString(xmlBufPtr buf,xmlChar *string)

{
  xmlChar *pxVar1;
  xmlChar *local_30;
  xmlChar *base;
  xmlChar *cur;
  xmlChar *string_local;
  xmlBufPtr buf_local;
  
  if ((buf == (xmlBufPtr)0x0) || (buf->error != 0)) {
    buf_local._4_4_ = -1;
  }
  else {
    if ((buf->size != (ulong)buf->compat_size) && (buf->compat_size < 0x7fffffff)) {
      buf->size = (ulong)buf->compat_size;
    }
    if ((buf->use != (ulong)buf->compat_use) && (buf->compat_use < 0x7fffffff)) {
      buf->use = (ulong)buf->compat_use;
    }
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
      buf_local._4_4_ = -1;
    }
    else {
      pxVar1 = xmlStrchr(string,'\"');
      if (pxVar1 == (xmlChar *)0x0) {
        xmlBufCCat(buf,"\"");
        xmlBufCat(buf,string);
        xmlBufCCat(buf,"\"");
      }
      else {
        pxVar1 = xmlStrchr(string,'\'');
        if (pxVar1 == (xmlChar *)0x0) {
          xmlBufCCat(buf,"\'");
          xmlBufCat(buf,string);
          xmlBufCCat(buf,"\'");
        }
        else {
          xmlBufCCat(buf,"\"");
          local_30 = string;
          base = string;
          while( true ) {
            if (*base == '\0') break;
            if (*base == '\"') {
              if (local_30 != base) {
                xmlBufAdd(buf,local_30,(int)base - (int)local_30);
              }
              xmlBufAdd(buf,(xmlChar *)"&quot;",6);
              local_30 = base + 1;
            }
            base = base + 1;
          }
          if (local_30 != base) {
            xmlBufAdd(buf,local_30,(int)base - (int)local_30);
          }
          xmlBufCCat(buf,"\"");
        }
      }
      buf_local._4_4_ = 0;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufWriteQuotedString(xmlBufPtr buf, const xmlChar *string) {
    const xmlChar *cur, *base;
    if ((buf == NULL) || (buf->error))
        return(-1);
    CHECK_COMPAT(buf)
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE)
        return(-1);
    if (xmlStrchr(string, '\"')) {
        if (xmlStrchr(string, '\'')) {
#ifdef DEBUG_BUFFER
	    xmlGenericError(xmlGenericErrorContext,
 "xmlBufWriteQuotedString: string contains quote and double-quotes !\n");
#endif
	    xmlBufCCat(buf, "\"");
            base = cur = string;
            while(*cur != 0){
                if(*cur == '"'){
                    if (base != cur)
                        xmlBufAdd(buf, base, cur - base);
                    xmlBufAdd(buf, BAD_CAST "&quot;", 6);
                    cur++;
                    base = cur;
                }
                else {
                    cur++;
                }
            }
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
	    xmlBufCCat(buf, "\"");
	}
        else{
	    xmlBufCCat(buf, "\'");
            xmlBufCat(buf, string);
	    xmlBufCCat(buf, "\'");
        }
    } else {
        xmlBufCCat(buf, "\"");
        xmlBufCat(buf, string);
        xmlBufCCat(buf, "\"");
    }
    return(0);
}